

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
          (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *this,
          BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *param_1)

{
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)this,
             (DenseStorage<double,__1,__1,__1,_1> *)param_1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->_idx_to_label,&param_1->_idx_to_label);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->_label_to_idx)._M_h,&(param_1->_label_to_idx)._M_h);
  this->m_vartype = param_1->m_vartype;
  this->m_offset = param_1->m_offset;
  return;
}

Assistant:

BinaryQuadraticModel( const BinaryQuadraticModel & ) = default;